

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O1

bool tcu::anon_unknown_3::pixelOnlyOnASharedEdge
               (IVec2 *pixel,SceneTriangle *triangle,IVec2 *viewportSize)

{
  float fVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  int i_6;
  int i;
  long lVar6;
  Vector<float,_2> *res_8;
  Vector<float,_2> *res_5;
  Vec2 triangleNormalizedDeviceSpace [3];
  Vector<float,_2> res_6;
  Vector<float,_2> res_7;
  Vector<float,_2> res_3;
  Vector<float,_2> res_4;
  Vector<float,_2> res;
  Vector<float,_2> res_1;
  Vec2 triangleScreenSpace [3];
  float local_c8 [4];
  float local_b8;
  float local_b4;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  float local_80;
  float local_7c;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  Vec2 local_68;
  Vec2 local_60;
  Vec2 local_58 [2];
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  
  if (((triangle->sharedEdge[0] != false) || (triangle->sharedEdge[1] != false)) ||
     (triangle->sharedEdge[2] == true)) {
    fVar1 = triangle->positions[0].m_data[3];
    local_c8[0] = triangle->positions[0].m_data[0] / fVar1;
    local_c8[1] = triangle->positions[0].m_data[1] / fVar1;
    fVar1 = triangle->positions[1].m_data[3];
    local_c8[2] = triangle->positions[1].m_data[0] / fVar1;
    local_c8[3] = triangle->positions[1].m_data[1] / fVar1;
    fVar1 = triangle->positions[2].m_data[3];
    local_b8 = triangle->positions[2].m_data[0] / fVar1;
    local_b4 = triangle->positions[2].m_data[1] / fVar1;
    local_38 = &DAT_3f8000003f800000;
    local_90 = 0;
    lVar6 = 0;
    do {
      local_c8[lVar6 + 0xe] = local_c8[lVar6] + *(float *)((long)&local_38 + lVar6 * 4);
      lVar6 = lVar6 + 1;
    } while (lVar6 == 1);
    local_88 = 0;
    lVar6 = 0;
    do {
      local_c8[lVar6 + 0x10] = local_c8[lVar6 + 0xe] * 0.5;
      lVar6 = lVar6 + 1;
    } while (lVar6 == 1);
    local_70 = (float)viewportSize->m_data[0];
    local_6c = (float)viewportSize->m_data[1];
    local_68.m_data[0] = 0.0;
    local_68.m_data[1] = 0.0;
    lVar6 = 0;
    do {
      local_68.m_data[lVar6] = local_c8[lVar6 + 0x10] * local_c8[lVar6 + 0x16];
      lVar6 = lVar6 + 1;
    } while (lVar6 == 1);
    local_40 = &DAT_3f8000003f800000;
    local_a0 = 0;
    lVar6 = 0;
    do {
      local_c8[lVar6 + 10] = local_c8[lVar6 + 2] + *(float *)((long)&local_40 + lVar6 * 4);
      lVar6 = lVar6 + 1;
    } while (lVar6 == 1);
    local_98 = 0;
    lVar6 = 0;
    do {
      local_c8[lVar6 + 0xc] = local_c8[lVar6 + 10] * 0.5;
      lVar6 = lVar6 + 1;
    } while (lVar6 == 1);
    local_78 = local_70;
    local_74 = local_6c;
    local_60.m_data[0] = 0.0;
    local_60.m_data[1] = 0.0;
    lVar6 = 0;
    do {
      local_58[-1].m_data[lVar6] = local_c8[lVar6 + 0xc] * local_c8[lVar6 + 0x14];
      lVar6 = lVar6 + 1;
    } while (lVar6 == 1);
    local_48 = &DAT_3f8000003f800000;
    local_b0 = 0;
    lVar6 = 0;
    do {
      local_c8[lVar6 + 6] = local_c8[lVar6 + 4] + *(float *)((long)&local_48 + lVar6 * 4);
      lVar6 = lVar6 + 1;
    } while (lVar6 == 1);
    local_a8 = 0;
    lVar6 = 0;
    do {
      local_c8[lVar6 + 8] = local_c8[lVar6 + 6] * 0.5;
      lVar6 = lVar6 + 1;
    } while (lVar6 == 1);
    local_80 = local_70;
    local_7c = local_6c;
    local_58[0].m_data[0] = 0.0;
    local_58[0].m_data[1] = 0.0;
    lVar6 = 0;
    do {
      local_58[0].m_data[lVar6] = local_c8[lVar6 + 8] * local_c8[lVar6 + 0x12];
      lVar6 = lVar6 + 1;
    } while (lVar6 == 1);
    bVar2 = pixelNearLineSegment(pixel,&local_68,&local_60);
    bVar3 = pixelNearLineSegment(pixel,&local_60,local_58);
    bVar4 = pixelNearLineSegment(pixel,local_58,&local_68);
    if ((!bVar3 && !bVar4) && bVar2) {
      bVar5 = triangle->sharedEdge[0];
LAB_01a0e49f:
      bVar2 = false;
    }
    else {
      if ((bVar3 && !bVar2) && !bVar4) {
        bVar5 = triangle->sharedEdge[1];
        goto LAB_01a0e49f;
      }
      bVar5 = !bVar4;
      if ((!bVar2 && !bVar3) && !(bool)bVar5) {
        bVar5 = triangle->sharedEdge[2];
        goto LAB_01a0e49f;
      }
      bVar2 = true;
    }
    if (!bVar2) goto LAB_01a0e4a7;
  }
  bVar5 = 0;
LAB_01a0e4a7:
  return (bool)(bVar5 & 1);
}

Assistant:

bool pixelOnlyOnASharedEdge (const tcu::IVec2& pixel, const TriangleSceneSpec::SceneTriangle& triangle, const tcu::IVec2& viewportSize)
{
	if (triangle.sharedEdge[0] || triangle.sharedEdge[1] || triangle.sharedEdge[2])
	{
		const tcu::Vec2 triangleNormalizedDeviceSpace[3] =
		{
			tcu::Vec2(triangle.positions[0].x() / triangle.positions[0].w(), triangle.positions[0].y() / triangle.positions[0].w()),
			tcu::Vec2(triangle.positions[1].x() / triangle.positions[1].w(), triangle.positions[1].y() / triangle.positions[1].w()),
			tcu::Vec2(triangle.positions[2].x() / triangle.positions[2].w(), triangle.positions[2].y() / triangle.positions[2].w()),
		};
		const tcu::Vec2 triangleScreenSpace[3] =
		{
			(triangleNormalizedDeviceSpace[0] + tcu::Vec2(1.0f, 1.0f)) * 0.5f * tcu::Vec2((float)viewportSize.x(), (float)viewportSize.y()),
			(triangleNormalizedDeviceSpace[1] + tcu::Vec2(1.0f, 1.0f)) * 0.5f * tcu::Vec2((float)viewportSize.x(), (float)viewportSize.y()),
			(triangleNormalizedDeviceSpace[2] + tcu::Vec2(1.0f, 1.0f)) * 0.5f * tcu::Vec2((float)viewportSize.x(), (float)viewportSize.y()),
		};

		const bool pixelOnEdge0 = pixelNearLineSegment(pixel, triangleScreenSpace[0], triangleScreenSpace[1]);
		const bool pixelOnEdge1 = pixelNearLineSegment(pixel, triangleScreenSpace[1], triangleScreenSpace[2]);
		const bool pixelOnEdge2 = pixelNearLineSegment(pixel, triangleScreenSpace[2], triangleScreenSpace[0]);

		// If the pixel is on a multiple edges return false

		if (pixelOnEdge0 && !pixelOnEdge1 && !pixelOnEdge2)
			return triangle.sharedEdge[0];
		if (!pixelOnEdge0 && pixelOnEdge1 && !pixelOnEdge2)
			return triangle.sharedEdge[1];
		if (!pixelOnEdge0 && !pixelOnEdge1 && pixelOnEdge2)
			return triangle.sharedEdge[2];
	}

	return false;
}